

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O0

void anon_unknown.dwarf_16af90::readFirstPart(string *fn)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int type;
  int width;
  undefined4 uVar5;
  undefined4 uVar6;
  int type_00;
  int iVar7;
  int iVar8;
  int iVar9;
  ostream *this;
  reference pvVar10;
  char *pcVar11;
  uint *puVar12;
  Box2i b2_1;
  Box2i b1_1;
  DeepFrameBuffer frameBuffer_3;
  int numYTiles_1;
  int numXTiles_1;
  int h_1;
  int w_1;
  int ly_1;
  int lx_1;
  int ty2_1;
  int ty1_1;
  int tx2_1;
  int tx1_1;
  int numYLevels_1;
  int numXLevels_1;
  DeepTiledInputFile part_3;
  int l2_1;
  int l1_1;
  DeepFrameBuffer frameBuffer_2;
  DeepScanLineInputFile part_2;
  Box2i b2;
  Box2i b1;
  FrameBuffer frameBuffer_1;
  int numYTiles;
  int numXTiles;
  int h;
  int w;
  int numYLevels;
  int numXLevels;
  int ly;
  int lx;
  int ty2;
  int ty1;
  int tx2;
  int tx1;
  TiledInputFile part_1;
  FrameBuffer frameBuffer;
  int l2;
  int l1;
  InputFile part;
  int levelMode;
  int partType;
  int pixelType;
  Array2D<unsigned_int> sampleCount;
  Array2D<Imath_3_2::half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  Array2D<Imath_3_2::half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  int in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  int in_stack_fffffffffffffb88;
  int y2;
  int in_stack_fffffffffffffb8c;
  int in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffb94;
  undefined1 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb99;
  undefined1 in_stack_fffffffffffffb9a;
  undefined1 in_stack_fffffffffffffb9b;
  int in_stack_fffffffffffffb9c;
  int iVar13;
  int in_stack_fffffffffffffba0;
  undefined4 uVar14;
  int in_stack_fffffffffffffba4;
  PixelType PVar15;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  undefined4 in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  int in_stack_fffffffffffffbc0;
  int in_stack_fffffffffffffbc4;
  int in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffc5c;
  undefined1 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc61;
  undefined1 in_stack_fffffffffffffc62;
  undefined1 in_stack_fffffffffffffc63;
  undefined4 in_stack_fffffffffffffc64;
  Array2D<float_*> *in_stack_fffffffffffffc68;
  Array2D<float> *fData_00;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  undefined8 in_stack_fffffffffffffc78;
  int iVar16;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  undefined1 local_360 [12];
  int local_354;
  undefined1 local_350 [16];
  Slice local_340 [56];
  Slice local_308 [104];
  undefined4 local_2a0;
  undefined4 local_29c;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  int local_278;
  undefined4 local_274;
  undefined1 local_270 [80];
  Slice local_220 [104];
  DeepFrameBuffer local_1b8;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  undefined1 local_128 [64];
  int local_e8;
  int local_e4;
  undefined1 local_e0 [56];
  Array2D<Imath_3_2::half_*> local_a8;
  Array2D<float_*> local_90;
  Array2D<unsigned_int_*> local_78;
  Array2D<Imath_3_2::half> local_60;
  Array2D<float> local_38;
  Array2D<unsigned_int> local_20;
  
  iVar13 = (int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  Imf_3_2::Array2D<unsigned_int>::Array2D(&local_20);
  Imf_3_2::Array2D<float>::Array2D(&local_38);
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D(&local_60);
  Imf_3_2::Array2D<unsigned_int_*>::Array2D(&local_78);
  Imf_3_2::Array2D<float_*>::Array2D(&local_90);
  Imf_3_2::Array2D<Imath_3_2::half_*>::Array2D(&local_a8);
  Imf_3_2::Array2D<unsigned_int>::Array2D((Array2D<unsigned_int> *)(local_e0 + 0x20));
  this = std::operator<<((ostream *)&std::cout,"Reading first part ");
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,0);
  local_e0._28_4_ = *pvVar10;
  pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::partTypes,0);
  local_e0._24_4_ = *pvVar10;
  pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::levelModes,0);
  local_e0._20_4_ = *pvVar10;
  switch(local_e0._24_4_) {
  case 0:
    iVar13 = local_e0._24_4_;
    pcVar11 = (char *)std::__cxx11::string::c_str();
    iVar2 = Imf_3_2::globalThreadCount();
    Imf_3_2::InputFile::InputFile((InputFile *)local_e0,pcVar11,iVar2);
    iVar16 = (int)((ulong)pcVar11 >> 0x20);
    iVar3 = random_int(in_stack_fffffffffffffb84);
    local_e4 = iVar3;
    iVar4 = random_int(in_stack_fffffffffffffb84);
    local_e8 = iVar4;
    if (iVar4 < local_e4) {
      std::swap<int>(&local_e4,&local_e8);
    }
    fData_00 = (Array2D<float> *)(local_128 + 0x10);
    Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x1de43c);
    setInputFrameBuffer((FrameBuffer *)CONCAT44(iVar2,in_stack_fffffffffffffc80),iVar16,
                        (Array2D<unsigned_int> *)CONCAT44(iVar3,iVar4),fData_00,
                        (Array2D<Imath_3_2::half> *)
                        CONCAT44(in_stack_fffffffffffffc64,
                                 CONCAT13(in_stack_fffffffffffffc63,
                                          CONCAT12(in_stack_fffffffffffffc62,
                                                   CONCAT11(in_stack_fffffffffffffc61,
                                                            in_stack_fffffffffffffc60)))),
                        in_stack_fffffffffffffc5c,iVar13);
    Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)local_e0);
    Imf_3_2::InputFile::readPixels((int)local_e0,local_e4);
    if (local_e0._28_4_ == 0) {
      bVar1 = checkPixels<unsigned_int>
                        ((Array2D<unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffb9c,
                                  CONCAT13(in_stack_fffffffffffffb9b,
                                           CONCAT12(in_stack_fffffffffffffb9a,
                                                    CONCAT11(in_stack_fffffffffffffb99,
                                                             in_stack_fffffffffffffb98)))),
                         in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                         in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88,
                         in_stack_fffffffffffffb84);
      if (!bVar1) {
        __assert_fail("checkPixels<unsigned int> ( uData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x450,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if (local_e0._28_4_ == 1) {
      bVar1 = checkPixels<float>((Array2D<float> *)
                                 CONCAT44(in_stack_fffffffffffffb9c,
                                          CONCAT13(in_stack_fffffffffffffb9b,
                                                   CONCAT12(in_stack_fffffffffffffb9a,
                                                            CONCAT11(in_stack_fffffffffffffb99,
                                                                     in_stack_fffffffffffffb98)))),
                                 in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                                 in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88,
                                 in_stack_fffffffffffffb84);
      if (!bVar1) {
        __assert_fail("checkPixels<float> ( fData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x454,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if ((local_e0._28_4_ == 2) &&
            (bVar1 = checkPixels<Imath_3_2::half>
                               ((Array2D<Imath_3_2::half> *)
                                CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                                in_stack_fffffffffffffba4,in_stack_fffffffffffffba0,
                                in_stack_fffffffffffffb9c,
                                CONCAT13(in_stack_fffffffffffffb9b,
                                         CONCAT12(in_stack_fffffffffffffb9a,
                                                  CONCAT11(in_stack_fffffffffffffb99,
                                                           in_stack_fffffffffffffb98))),
                                in_stack_fffffffffffffb94), !bVar1)) {
      __assert_fail("checkPixels<half> (hData, 0, width - 1, l1, l2, width)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x458,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1de644);
    Imf_3_2::InputFile::~InputFile((InputFile *)local_e0);
    break;
  case 1:
    iVar2 = local_e0._24_4_;
    pcVar11 = (char *)std::__cxx11::string::c_str();
    iVar3 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)local_128,pcVar11,iVar3);
    local_144 = Imf_3_2::TiledInputFile::numXLevels();
    local_148 = Imf_3_2::TiledInputFile::numYLevels();
    local_13c = random_int(in_stack_fffffffffffffb84);
    local_140 = random_int(in_stack_fffffffffffffb84);
    if (local_e0._20_4_ == 1) {
      local_140 = local_13c;
    }
    local_14c = Imf_3_2::TiledInputFile::levelWidth((int)local_128);
    local_150 = Imf_3_2::TiledInputFile::levelHeight((int)local_128);
    local_1b8._100_4_ = Imf_3_2::TiledInputFile::numXTiles((int)local_128);
    local_1b8._96_4_ = Imf_3_2::TiledInputFile::numYTiles((int)local_128);
    local_12c = random_int(in_stack_fffffffffffffb84);
    local_130 = random_int(in_stack_fffffffffffffb84);
    local_134 = random_int(in_stack_fffffffffffffb84);
    local_138 = random_int(in_stack_fffffffffffffb84);
    if (local_130 < local_12c) {
      std::swap<int>(&local_12c,&local_130);
    }
    if (local_138 < local_134) {
      std::swap<int>(&local_134,&local_138);
    }
    Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x1de901);
    setInputFrameBuffer((FrameBuffer *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80)
                        ,iVar13,(Array2D<unsigned_int> *)
                                CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                        (Array2D<float> *)in_stack_fffffffffffffc68,
                        (Array2D<Imath_3_2::half> *)
                        CONCAT44(in_stack_fffffffffffffc64,
                                 CONCAT13(in_stack_fffffffffffffc63,
                                          CONCAT12(in_stack_fffffffffffffc62,
                                                   CONCAT11(in_stack_fffffffffffffc61,
                                                            in_stack_fffffffffffffc60)))),iVar3,
                        iVar2);
    Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)local_128);
    Imf_3_2::TiledInputFile::readTiles
              ((int)local_128,local_12c,local_130,local_134,local_138,local_13c);
    Imf_3_2::TiledInputFile::dataWindowForTile
              ((int)&local_1b8 + 0x20,(int)local_128,local_12c,local_134);
    Imf_3_2::TiledInputFile::dataWindowForTile
              ((int)&local_1b8 + 0x10,(int)local_128,local_130,local_138);
    if (local_e0._28_4_ == 0) {
      bVar1 = checkPixels<unsigned_int>
                        ((Array2D<unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffb9c,
                                  CONCAT13(in_stack_fffffffffffffb9b,
                                           CONCAT12(in_stack_fffffffffffffb9a,
                                                    CONCAT11(in_stack_fffffffffffffb99,
                                                             in_stack_fffffffffffffb98)))),
                         in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                         in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88,
                         in_stack_fffffffffffffb84);
      if (!bVar1) {
        __assert_fail("checkPixels<unsigned int> ( uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x485,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if (local_e0._28_4_ == 1) {
      bVar1 = checkPixels<float>((Array2D<float> *)
                                 CONCAT44(in_stack_fffffffffffffb9c,
                                          CONCAT13(in_stack_fffffffffffffb9b,
                                                   CONCAT12(in_stack_fffffffffffffb9a,
                                                            CONCAT11(in_stack_fffffffffffffb99,
                                                                     in_stack_fffffffffffffb98)))),
                                 in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                                 in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88,
                                 in_stack_fffffffffffffb84);
      if (!bVar1) {
        __assert_fail("checkPixels<float> ( fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x489,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if ((local_e0._28_4_ == 2) &&
            (bVar1 = checkPixels<Imath_3_2::half>
                               ((Array2D<Imath_3_2::half> *)
                                CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                                in_stack_fffffffffffffba4,in_stack_fffffffffffffba0,
                                in_stack_fffffffffffffb9c,
                                CONCAT13(in_stack_fffffffffffffb9b,
                                         CONCAT12(in_stack_fffffffffffffb9a,
                                                  CONCAT11(in_stack_fffffffffffffb99,
                                                           in_stack_fffffffffffffb98))),
                                in_stack_fffffffffffffb94), !bVar1)) {
      __assert_fail("checkPixels<half> ( hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x48d,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1debb6);
    Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)local_128);
    break;
  case 2:
    iVar2 = local_e0._24_4_;
    pcVar11 = (char *)std::__cxx11::string::c_str();
    iVar3 = Imf_3_2::globalThreadCount();
    Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile
              ((DeepScanLineInputFile *)&local_1b8,pcVar11,iVar3);
    Imf_3_2::DeepFrameBuffer::DeepFrameBuffer
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    Imf_3_2::Array2D<unsigned_int>::resizeErase
              ((Array2D<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               CONCAT44(in_stack_fffffffffffffb9c,
                        CONCAT13(in_stack_fffffffffffffb9b,
                                 CONCAT12(in_stack_fffffffffffffb9a,
                                          CONCAT11(in_stack_fffffffffffffb99,
                                                   in_stack_fffffffffffffb98)))),
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[]
                        ((Array2D<unsigned_int> *)(local_e0 + 0x20),0);
    iVar3 = 0;
    Imf_3_2::Slice::Slice
              ((Slice *)(local_270 + 0x18),UINT,(char *)puVar12,4,0x304,1,1,0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insertSampleCountSlice(local_220);
    setInputDeepFrameBuffer
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               iVar13,(Array2D<unsigned_int_*> *)
                      CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,
               (Array2D<Imath_3_2::half_*> *)
               CONCAT44(in_stack_fffffffffffffc64,
                        CONCAT13(in_stack_fffffffffffffc63,
                                 CONCAT12(in_stack_fffffffffffffc62,
                                          CONCAT11(in_stack_fffffffffffffc61,
                                                   in_stack_fffffffffffffc60)))),
               in_stack_fffffffffffffc5c,iVar2);
    Imf_3_2::DeepScanLineInputFile::setFrameBuffer(&local_1b8);
    local_270._20_4_ = random_int(in_stack_fffffffffffffb84);
    local_270._16_4_ = random_int(in_stack_fffffffffffffb84);
    if ((int)local_270._16_4_ < (int)local_270._20_4_) {
      std::swap<int>((int *)(local_270 + 0x14),(int *)(local_270 + 0x10));
    }
    Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)&local_1b8,local_270._20_4_);
    bVar1 = checkSampleCount((Array2D<unsigned_int> *)
                             CONCAT44(in_stack_fffffffffffffb9c,
                                      CONCAT13(in_stack_fffffffffffffb9b,
                                               CONCAT12(in_stack_fffffffffffffb9a,
                                                        CONCAT11(in_stack_fffffffffffffb99,
                                                                 in_stack_fffffffffffffb98)))),
                             in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                             in_stack_fffffffffffffb8c,iVar3,in_stack_fffffffffffffb84);
    if (!bVar1) {
      __assert_fail("checkSampleCount (sampleCount, 0, width - 1, l1, l2, width)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x4b1,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    allocatePixels(in_stack_fffffffffffffbc4,
                   (Array2D<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                   (Array2D<unsigned_int_*> *)
                   CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (Array2D<float_*> *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                   ,(Array2D<Imath_3_2::half_*> *)
                    CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                   in_stack_fffffffffffffb9c,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbd8,
                   in_stack_fffffffffffffbe0);
    Imf_3_2::DeepScanLineInputFile::readPixels((int)&local_1b8,local_270._20_4_);
    if (local_e0._28_4_ == 0) {
      bVar1 = checkPixels<unsigned_int>
                        ((Array2D<unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                         (Array2D<unsigned_int_*> *)
                         CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                         in_stack_fffffffffffffb9c,
                         CONCAT13(in_stack_fffffffffffffb9b,
                                  CONCAT12(in_stack_fffffffffffffb9a,
                                           CONCAT11(in_stack_fffffffffffffb99,
                                                    in_stack_fffffffffffffb98))),
                         in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                         in_stack_fffffffffffffbc0);
      if (!bVar1) {
        __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, 0, width - 1, l1, l2, width)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x4c4,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if (local_e0._28_4_ == 1) {
      bVar1 = checkPixels<float>((Array2D<unsigned_int> *)
                                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                                 (Array2D<float_*> *)
                                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                                 in_stack_fffffffffffffb9c,
                                 CONCAT13(in_stack_fffffffffffffb9b,
                                          CONCAT12(in_stack_fffffffffffffb9a,
                                                   CONCAT11(in_stack_fffffffffffffb99,
                                                            in_stack_fffffffffffffb98))),
                                 in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                                 in_stack_fffffffffffffbc0);
      if (!bVar1) {
        __assert_fail("checkPixels<float> ( sampleCount, deepFData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x4c8,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if ((local_e0._28_4_ == 2) &&
            (bVar1 = checkPixels<Imath_3_2::half>
                               ((Array2D<unsigned_int> *)
                                CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                                (Array2D<Imath_3_2::half_*> *)
                                CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                                in_stack_fffffffffffffb9c,
                                CONCAT13(in_stack_fffffffffffffb9b,
                                         CONCAT12(in_stack_fffffffffffffb9a,
                                                  CONCAT11(in_stack_fffffffffffffb99,
                                                           in_stack_fffffffffffffb98))),
                                in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                                in_stack_fffffffffffffbc0), !bVar1)) {
      __assert_fail("checkPixels<half> ( sampleCount, deepHData, 0, width - 1, l1, l2, width)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x4cc,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    in_stack_fffffffffffffb80 = local_270._16_4_;
    releasePixels(in_stack_fffffffffffffbb4,
                  (Array2D<unsigned_int_*> *)
                  CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                  (Array2D<float_*> *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                  (Array2D<Imath_3_2::half_*> *)
                  CONCAT44(in_stack_fffffffffffffb9c,
                           CONCAT13(in_stack_fffffffffffffb9b,
                                    CONCAT12(in_stack_fffffffffffffb9a,
                                             CONCAT11(in_stack_fffffffffffffb99,
                                                      in_stack_fffffffffffffb98)))),
                  in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,in_stack_fffffffffffffbc0,
                  in_stack_fffffffffffffbc8);
    Imf_3_2::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1df048);
    Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile((DeepScanLineInputFile *)&local_1b8);
    break;
  case 3:
    iVar2 = local_e0._24_4_;
    pcVar11 = (char *)std::__cxx11::string::c_str();
    iVar3 = Imf_3_2::globalThreadCount();
    Imf_3_2::DeepTiledInputFile::DeepTiledInputFile((DeepTiledInputFile *)local_270,pcVar11,iVar3);
    iVar16 = (int)pcVar11;
    local_274 = Imf_3_2::DeepTiledInputFile::numXLevels();
    iVar3 = Imf_3_2::DeepTiledInputFile::numYLevels();
    local_278 = iVar3;
    local_28c = random_int(in_stack_fffffffffffffb84);
    iVar4 = random_int(in_stack_fffffffffffffb84);
    local_290 = iVar4;
    if (local_e0._20_4_ == 1) {
      local_290 = local_28c;
    }
    type = Imf_3_2::DeepTiledInputFile::levelWidth((int)local_270);
    local_294 = type;
    width = Imf_3_2::DeepTiledInputFile::levelHeight((int)local_270);
    local_298 = width;
    uVar5 = Imf_3_2::DeepTiledInputFile::numXTiles((int)local_270);
    local_29c = uVar5;
    uVar6 = Imf_3_2::DeepTiledInputFile::numYTiles((int)local_270);
    local_2a0 = uVar6;
    type_00 = random_int(in_stack_fffffffffffffb84);
    local_27c = type_00;
    iVar7 = random_int(in_stack_fffffffffffffb84);
    local_280 = iVar7;
    iVar8 = random_int(in_stack_fffffffffffffb84);
    local_284 = iVar8;
    iVar9 = random_int(in_stack_fffffffffffffb84);
    local_288 = iVar9;
    if (local_280 < local_27c) {
      std::swap<int>(&local_27c,&local_280);
    }
    if (local_288 < local_284) {
      std::swap<int>(&local_284,&local_288);
    }
    Imf_3_2::DeepFrameBuffer::DeepFrameBuffer
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    Imf_3_2::Array2D<unsigned_int>::resizeErase
              ((Array2D<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               CONCAT44(in_stack_fffffffffffffb9c,
                        CONCAT13(in_stack_fffffffffffffb9b,
                                 CONCAT12(in_stack_fffffffffffffb9a,
                                          CONCAT11(in_stack_fffffffffffffb99,
                                                   in_stack_fffffffffffffb98)))),
               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    PVar15 = UINT;
    puVar12 = Imf_3_2::Array2D<unsigned_int>::operator[]
                        ((Array2D<unsigned_int> *)(local_e0 + 0x20),0);
    y2 = 0;
    Imf_3_2::Slice::Slice
              (local_340,PVar15,(char *)puVar12,4,(long)local_294 << 2,1,1,0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insertSampleCountSlice(local_308);
    setInputDeepFrameBuffer
              ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               iVar13,(Array2D<unsigned_int_*> *)
                      CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,
               (Array2D<Imath_3_2::half_*> *)
               CONCAT44(in_stack_fffffffffffffc64,
                        CONCAT13(in_stack_fffffffffffffc63,
                                 CONCAT12(in_stack_fffffffffffffc62,
                                          CONCAT11(in_stack_fffffffffffffc61,
                                                   in_stack_fffffffffffffc60)))),
               in_stack_fffffffffffffc5c,iVar2);
    Imf_3_2::DeepTiledInputFile::setFrameBuffer((DeepFrameBuffer *)local_270);
    Imf_3_2::DeepTiledInputFile::readPixelSampleCounts
              ((int)local_270,local_27c,local_280,local_284,local_288,local_28c);
    Imf_3_2::DeepTiledInputFile::dataWindowForTile
              ((int)local_350,(int)local_270,local_27c,local_284);
    Imf_3_2::DeepTiledInputFile::dataWindowForTile
              ((int)local_360,(int)local_270,local_280,local_288);
    bVar1 = checkSampleCount((Array2D<unsigned_int> *)
                             CONCAT44(in_stack_fffffffffffffb9c,
                                      CONCAT13(in_stack_fffffffffffffb9b,
                                               CONCAT12(in_stack_fffffffffffffb9a,
                                                        CONCAT11(in_stack_fffffffffffffb99,
                                                                 in_stack_fffffffffffffb98)))),
                             in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,
                             in_stack_fffffffffffffb8c,y2,in_stack_fffffffffffffb84);
    uVar14 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffba0);
    if (!bVar1) {
      __assert_fail("checkSampleCount ( sampleCount, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x506,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    allocatePixels(type,(Array2D<unsigned_int> *)CONCAT44(uVar5,uVar6),
                   (Array2D<unsigned_int_*> *)CONCAT44(type_00,iVar7),
                   (Array2D<float_*> *)CONCAT44(iVar8,iVar9),
                   (Array2D<Imath_3_2::half_*> *)CONCAT44(PVar15,uVar14),in_stack_fffffffffffffb9c,
                   iVar3,iVar16,in_stack_fffffffffffffbe0);
    Imf_3_2::DeepTiledInputFile::readTiles
              ((int)local_270,local_27c,local_280,local_284,local_288,local_28c);
    iVar13 = local_e0._28_4_;
    if (local_e0._28_4_ == 0) {
      in_stack_fffffffffffffb9b =
           checkPixels<unsigned_int>
                     ((Array2D<unsigned_int> *)CONCAT44(iVar8,iVar9),
                      (Array2D<unsigned_int_*> *)CONCAT44(PVar15,uVar14),0,
                      CONCAT13(in_stack_fffffffffffffb9b,
                               CONCAT12(in_stack_fffffffffffffb9a,
                                        CONCAT11(in_stack_fffffffffffffb99,in_stack_fffffffffffffb98
                                                ))),in_stack_fffffffffffffb94,
                      in_stack_fffffffffffffb90,width);
      if (!(bool)in_stack_fffffffffffffb9b) {
        __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x51f,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if (local_e0._28_4_ == 1) {
      in_stack_fffffffffffffb9a =
           checkPixels<float>((Array2D<unsigned_int> *)CONCAT44(iVar8,iVar9),
                              (Array2D<float_*> *)CONCAT44(PVar15,uVar14),1,
                              CONCAT13(in_stack_fffffffffffffb9b,
                                       CONCAT12(in_stack_fffffffffffffb9a,
                                                CONCAT11(in_stack_fffffffffffffb99,
                                                         in_stack_fffffffffffffb98))),
                              in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,width);
      if (!(bool)in_stack_fffffffffffffb9a) {
        __assert_fail("checkPixels<float> ( sampleCount, deepFData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                      ,0x529,"void (anonymous namespace)::readFirstPart(const std::string &)");
      }
    }
    else if ((local_e0._28_4_ == 2) &&
            (in_stack_fffffffffffffb99 =
                  checkPixels<Imath_3_2::half>
                            ((Array2D<unsigned_int> *)CONCAT44(iVar8,iVar9),
                             (Array2D<Imath_3_2::half_*> *)CONCAT44(PVar15,uVar14),2,
                             CONCAT13(in_stack_fffffffffffffb9b,
                                      CONCAT12(in_stack_fffffffffffffb9a,
                                               CONCAT11(in_stack_fffffffffffffb99,
                                                        in_stack_fffffffffffffb98))),
                             in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,width),
            !(bool)in_stack_fffffffffffffb99)) {
      __assert_fail("checkPixels<half> ( sampleCount, deepHData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartFileMixingBasic.cpp"
                    ,0x533,"void (anonymous namespace)::readFirstPart(const std::string &)");
    }
    releasePixels(type_00,(Array2D<unsigned_int_*> *)CONCAT44(iVar8,iVar9),
                  (Array2D<float_*> *)CONCAT44(PVar15,uVar14),
                  (Array2D<Imath_3_2::half_*> *)
                  CONCAT44(iVar13,CONCAT13(in_stack_fffffffffffffb9b,
                                           CONCAT12(in_stack_fffffffffffffb9a,
                                                    CONCAT11(in_stack_fffffffffffffb99,
                                                             in_stack_fffffffffffffb98)))),
                  in_stack_fffffffffffffb94,in_stack_fffffffffffffb90,width,iVar4);
    Imf_3_2::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1df742);
    Imf_3_2::DeepTiledInputFile::~DeepTiledInputFile((DeepTiledInputFile *)local_270);
    in_stack_fffffffffffffb80 = local_354;
  }
  Imf_3_2::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80))
  ;
  Imf_3_2::Array2D<Imath_3_2::half_*>::~Array2D
            ((Array2D<Imath_3_2::half_*> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  Imf_3_2::Array2D<float_*>::~Array2D
            ((Array2D<float_*> *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  Imf_3_2::Array2D<unsigned_int_*>::~Array2D
            ((Array2D<unsigned_int_*> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  Imf_3_2::Array2D<Imath_3_2::half>::~Array2D
            ((Array2D<Imath_3_2::half> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  Imf_3_2::Array2D<float>::~Array2D
            ((Array2D<float> *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  Imf_3_2::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80))
  ;
  return;
}

Assistant:

void
readFirstPart (const std::string& fn)
{
    Array2D<unsigned int> uData;
    Array2D<float>        fData;
    Array2D<half>         hData;

    Array2D<unsigned int*> deepUData;
    Array2D<float*>        deepFData;
    Array2D<half*>         deepHData;

    Array2D<unsigned int> sampleCount;

    cout << "Reading first part " << flush;
    int pixelType = pixelTypes[0];
    int partType  = partTypes[0];
    int levelMode = levelModes[0];
    switch (partType)
    {
        case 0: {
            InputFile part (fn.c_str ());

            int l1, l2;
            l1 = random_int (height);
            l2 = random_int (height);
            if (l1 > l2) swap (l1, l2);

            FrameBuffer frameBuffer;
            setInputFrameBuffer (
                frameBuffer, pixelType, uData, fData, hData, width, height);

            part.setFrameBuffer (frameBuffer);
            part.readPixels (l1, l2);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        uData, 0, width - 1, l1, l2, width));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        fData, 0, width - 1, l1, l2, width));
                    break;
                case 2:
                    assert (
                        checkPixels<half> (hData, 0, width - 1, l1, l2, width));
                    break;
            }

            break;
        }
        case 1: {
            TiledInputFile part (fn.c_str ());

            int tx1, tx2, ty1, ty2;
            int lx, ly;

            int numXLevels = part.numXLevels ();
            int numYLevels = part.numYLevels ();

            lx = random_int (numXLevels);
            ly = random_int (numYLevels);
            if (levelMode == 1) ly = lx;

            int w = part.levelWidth (lx);
            int h = part.levelHeight (ly);

            int numXTiles = part.numXTiles (lx);
            int numYTiles = part.numYTiles (ly);
            tx1           = random_int (numXTiles);
            tx2           = random_int (numXTiles);
            ty1           = random_int (numYTiles);
            ty2           = random_int (numYTiles);
            if (tx1 > tx2) swap (tx1, tx2);
            if (ty1 > ty2) swap (ty1, ty2);

            FrameBuffer frameBuffer;
            setInputFrameBuffer (
                frameBuffer, pixelType, uData, fData, hData, w, h);

            part.setFrameBuffer (frameBuffer);
            part.readTiles (tx1, tx2, ty1, ty2, lx, ly);

            Box2i b1 = part.dataWindowForTile (tx1, ty1, lx, ly);
            Box2i b2 = part.dataWindowForTile (tx2, ty2, lx, ly);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
                case 2:
                    assert (checkPixels<half> (
                        hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));
                    break;
            }

            break;
        }
        case 2: {
            DeepScanLineInputFile part (fn.c_str ());

            DeepFrameBuffer frameBuffer;

            sampleCount.resizeErase (height, width);
            frameBuffer.insertSampleCountSlice (Slice (
                OPENEXR_IMF_NAMESPACE::UINT,
                (char*) (&sampleCount[0][0]),
                sizeof (unsigned int) * 1,
                sizeof (unsigned int) * width));

            setInputDeepFrameBuffer (
                frameBuffer,
                pixelType,
                deepUData,
                deepFData,
                deepHData,
                width,
                height);

            part.setFrameBuffer (frameBuffer);

            int l1, l2;
            l1 = random_int (height);
            l2 = random_int (height);
            if (l1 > l2) swap (l1, l2);

            part.readPixelSampleCounts (l1, l2);
            assert (
                checkSampleCount (sampleCount, 0, width - 1, l1, l2, width));

            allocatePixels (
                pixelType,
                sampleCount,
                deepUData,
                deepFData,
                deepHData,
                0,
                width - 1,
                l1,
                l2);

            part.readPixels (l1, l2);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        sampleCount, deepUData, 0, width - 1, l1, l2, width));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        sampleCount, deepFData, 0, width - 1, l1, l2, width));
                    break;
                case 2:
                    assert (checkPixels<half> (
                        sampleCount, deepHData, 0, width - 1, l1, l2, width));
                    break;
            }

            releasePixels (
                pixelType,
                deepUData,
                deepFData,
                deepHData,
                0,
                width - 1,
                l1,
                l2);

            break;
        }
        case 3: {
            DeepTiledInputFile part (fn.c_str ());
            int                numXLevels = part.numXLevels ();
            int                numYLevels = part.numYLevels ();

            int tx1, tx2, ty1, ty2;
            int lx, ly;
            lx = random_int (numXLevels);
            ly = random_int (numYLevels);
            if (levelMode == 1) ly = lx;

            int w = part.levelWidth (lx);
            int h = part.levelHeight (ly);

            int numXTiles = part.numXTiles (lx);
            int numYTiles = part.numYTiles (ly);
            tx1           = random_int (numXTiles);
            tx2           = random_int (numXTiles);
            ty1           = random_int (numYTiles);
            ty2           = random_int (numYTiles);
            if (tx1 > tx2) swap (tx1, tx2);
            if (ty1 > ty2) swap (ty1, ty2);

            DeepFrameBuffer frameBuffer;

            sampleCount.resizeErase (h, w);
            frameBuffer.insertSampleCountSlice (Slice (
                IMF::UINT,
                (char*) (&sampleCount[0][0]),
                sizeof (unsigned int) * 1,
                sizeof (unsigned int) * w));

            setInputDeepFrameBuffer (
                frameBuffer, pixelType, deepUData, deepFData, deepHData, w, h);

            part.setFrameBuffer (frameBuffer);

            part.readPixelSampleCounts (tx1, tx2, ty1, ty2, lx, ly);

            Box2i b1 = part.dataWindowForTile (tx1, ty1, lx, ly);
            Box2i b2 = part.dataWindowForTile (tx2, ty2, lx, ly);
            assert (checkSampleCount (
                sampleCount, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w));

            allocatePixels (
                pixelType,
                sampleCount,
                deepUData,
                deepFData,
                deepHData,
                b1.min.x,
                b2.max.x,
                b1.min.y,
                b2.max.y);

            part.readTiles (tx1, tx2, ty1, ty2, lx, ly);

            switch (pixelType)
            {
                case 0:
                    assert (checkPixels<unsigned int> (
                        sampleCount,
                        deepUData,
                        b1.min.x,
                        b2.max.x,
                        b1.min.y,
                        b2.max.y,
                        w));
                    break;
                case 1:
                    assert (checkPixels<float> (
                        sampleCount,
                        deepFData,
                        b1.min.x,
                        b2.max.x,
                        b1.min.y,
                        b2.max.y,
                        w));
                    break;
                case 2:
                    assert (checkPixels<half> (
                        sampleCount,
                        deepHData,
                        b1.min.x,
                        b2.max.x,
                        b1.min.y,
                        b2.max.y,
                        w));
                    break;
            }

            releasePixels (
                pixelType,
                deepUData,
                deepFData,
                deepHData,
                b1.min.x,
                b2.max.x,
                b1.min.y,
                b2.max.y);

            break;
        }
    }
}